

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uint parse_hex4(char *str)

{
  int iVar1;
  char *pcVar2;
  uint local_1c;
  uint h;
  char *str_local;
  
  if ((*str < '0') || ('9' < *str)) {
    if ((*str < 'A') || ('F' < *str)) {
      if ((*str < 'a') || ('f' < *str)) {
        return 0;
      }
      local_1c = *str + -0x57;
    }
    else {
      local_1c = *str + -0x37;
    }
  }
  else {
    local_1c = *str + -0x30;
  }
  pcVar2 = str + 1;
  if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
    if ((*pcVar2 < 'A') || ('F' < *pcVar2)) {
      if ((*pcVar2 < 'a') || ('f' < *pcVar2)) {
        return 0;
      }
      iVar1 = *pcVar2 + -0x57;
    }
    else {
      iVar1 = *pcVar2 + -0x37;
    }
  }
  else {
    iVar1 = *pcVar2 + -0x30;
  }
  local_1c = iVar1 + local_1c * 0x10;
  pcVar2 = str + 2;
  if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
    if ((*pcVar2 < 'A') || ('F' < *pcVar2)) {
      if ((*pcVar2 < 'a') || ('f' < *pcVar2)) {
        return 0;
      }
      iVar1 = *pcVar2 + -0x57;
    }
    else {
      iVar1 = *pcVar2 + -0x37;
    }
  }
  else {
    iVar1 = *pcVar2 + -0x30;
  }
  local_1c = iVar1 + local_1c * 0x10;
  pcVar2 = str + 3;
  if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
    if ((*pcVar2 < 'A') || ('F' < *pcVar2)) {
      if ((*pcVar2 < 'a') || ('f' < *pcVar2)) {
        return 0;
      }
      iVar1 = *pcVar2 + -0x57;
    }
    else {
      iVar1 = *pcVar2 + -0x37;
    }
  }
  else {
    iVar1 = *pcVar2 + -0x30;
  }
  local_1c = iVar1 + local_1c * 0x10;
  return local_1c;
}

Assistant:

static unsigned parse_hex4(const char *str)
{
	unsigned h=0;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	return h;
}